

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsim.cpp
# Opt level: O2

void transition(int64_t k)

{
  pointer pBVar1;
  Btor2Line *pBVar2;
  long lVar3;
  char *__filename;
  size_t i;
  ulong pos;
  long lVar4;
  long lVar5;
  BtorSimState update;
  
  __filename = "transition %ld";
  lVar4 = 0;
  msg(1,"transition %ld",k);
  lVar3 = num_format_lines;
  for (lVar5 = 0; lVar5 < lVar3; lVar5 = lVar5 + 1) {
    if (*(int *)((long)&(current_state.
                         super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
                         super__Vector_impl_data._M_start)->type + lVar4) != 0) {
      BtorSimState::remove
                ((BtorSimState *)
                 ((long)&(current_state.
                          super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
                          super__Vector_impl_data._M_start)->type + lVar4),__filename);
      lVar3 = num_format_lines;
    }
    lVar4 = lVar4 + 0x10;
  }
  if ((print_trace == '\0') && (print_states == '\x01')) {
    printf("#%ld\n",k);
  }
  for (pos = 0; pos < (ulong)((long)states.
                                    super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)states.
                                    super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3); pos = pos + 1) {
    pBVar2 = states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
             super__Vector_impl_data._M_start[pos];
    pBVar1 = next_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
             super__Vector_impl_data._M_start + pBVar2->id;
    update.type = pBVar1->type;
    update._4_4_ = *(undefined4 *)&pBVar1->field_0x4;
    update.field_1 = pBVar1->field_1;
    update_current_state(pBVar2->id,&update);
    if ((next_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
         super__Vector_impl_data._M_start[pBVar2->id].type == ARRAY) ||
       (next_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
        super__Vector_impl_data._M_start[pBVar2->id].type == BITVEC)) {
      next_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
      super__Vector_impl_data._M_start[pBVar2->id].field_1.bv_state = (BtorSimBitVector *)0x0;
    }
    else {
      die("Invalid state type");
    }
    if ((print_trace == '\0') && (print_states == '\x01')) {
      print_state_or_input(pBVar2->id,pos,k,false);
    }
  }
  return;
}

Assistant:

static void
transition (int64_t k)
{
  msg (1, "transition %" PRId64, k);
  for (int64_t i = 0; i < num_format_lines; i++) delete_current_state (i);
  if (print_trace && print_states) printf ("#%" PRId64 "\n", k);
  for (size_t i = 0; i < states.size (); i++)
  {
    Btor2Line *state = states[i];
    assert (0 <= state->id), assert (state->id < num_format_lines);
    BtorSimState update = next_state[state->id];
    assert (update.is_set ());
    update_current_state (state->id, update);
    switch (next_state[state->id].type)
    {
      case BtorSimState::Type::BITVEC:
        next_state[state->id].bv_state = nullptr;
        break;
      case BtorSimState::Type::ARRAY:
        next_state[state->id].array_state = nullptr;
        break;
      default: die ("Invalid state type");
    }
    if (print_trace && print_states)
      print_state_or_input (state->id, i, k, false);
  }
}